

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

bool __thiscall mat_lib::matrix<double>::operator==(matrix<double> *this,matrix<double> *m)

{
  double dVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  long lVar5;
  element_t *peVar6;
  size_t sVar7;
  size_t sVar8;
  
  sVar2 = this->rows__;
  if ((sVar2 == m->rows__) && (sVar3 = this->columns__, sVar3 == m->columns__)) {
    bVar4 = true;
    if (sVar2 != 0) {
      peVar6 = m->elements__;
      sVar7 = 0;
      do {
        if (sVar3 != 0) {
          lVar5 = 0;
          sVar8 = 0;
          do {
            dVar1 = *(double *)((long)this->elements__ + (lVar5 >> 0x1d) + sVar7 * sVar3 * 8);
            if ((dVar1 != peVar6[sVar8]) || (NAN(dVar1) || NAN(peVar6[sVar8]))) {
              return false;
            }
            sVar8 = sVar8 + 1;
            lVar5 = lVar5 + 0x100000000;
          } while (sVar3 != sVar8);
        }
        sVar7 = sVar7 + 1;
        peVar6 = peVar6 + sVar3;
        if (sVar7 == sVar2) {
          return true;
        }
      } while( true );
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool matrix<T>::operator==(const matrix<T>& m) const
  {
    if((rows__!=m.rows()) || (columns__!=m.columns())) return false; 

    for(size_t i=0; i<rows__; i++)
      for(size_t j=0; j<columns__; j++) 
        if(elements__[offset__(i,j)]!=m[i][j]) return false;
    
    return true;
  }